

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

void RangeEnc_ShiftLow(CRangeEnc *p)

{
  UInt64 *pUVar1;
  Byte BVar2;
  Byte *pBVar3;
  
  if (p->low >> 0x18 != 0xff) {
    BVar2 = p->cache;
    do {
      pBVar3 = p->buf;
      *pBVar3 = BVar2 + *(char *)((long)&p->low + 4);
      pBVar3 = pBVar3 + 1;
      p->buf = pBVar3;
      if (pBVar3 == p->bufLim) {
        RangeEnc_FlushStream(p);
      }
      pUVar1 = &p->cacheSize;
      *pUVar1 = *pUVar1 - 1;
      BVar2 = 0xff;
    } while (*pUVar1 != 0);
    p->cache = *(Byte *)((long)&p->low + 3);
  }
  p->cacheSize = p->cacheSize + 1;
  p->low = (ulong)(uint)((int)p->low << 8);
  return;
}

Assistant:

static void MY_FAST_CALL RangeEnc_ShiftLow(CRangeEnc *p)
{
  if ((UInt32)p->low < (UInt32)0xFF000000 || (unsigned)(p->low >> 32) != 0)
  {
    Byte temp = p->cache;
    do
    {
      Byte *buf = p->buf;
      *buf++ = (Byte)(temp + (Byte)(p->low >> 32));
      p->buf = buf;
      if (buf == p->bufLim)
        RangeEnc_FlushStream(p);
      temp = 0xFF;
    }
    while (--p->cacheSize != 0);
    p->cache = (Byte)((UInt32)p->low >> 24);
  }
  p->cacheSize++;
  p->low = (UInt32)p->low << 8;
}